

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
write_int<int>(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
               *this,int value,format_specs *spec)

{
  byte bVar1;
  undefined1 auStack_40 [8];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> w;
  
  auStack_40 = (undefined1  [8])
               (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  w.out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)(this->locale_).locale_;
  w.abs_value = 0;
  if (value < 0) {
    w.specs._4_1_ = 0x2d;
    w.abs_value = 1;
    w.specs._0_4_ = -value;
  }
  else {
    bVar1 = (byte)spec->field_0x9 >> 4 & 7;
    w.specs._0_4_ = value;
    if (1 < bVar1) {
      w.specs._4_1_ = 0x20;
      if (bVar1 == 2) {
        w.specs._4_1_ = 0x2b;
      }
      w.abs_value = 1;
    }
  }
  w.locale.locale_ = spec;
  handle_int_type_spec<fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned_int>&>
            (spec->type,
             (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *)auStack_40);
  (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)auStack_40;
  return;
}

Assistant:

void write_int(T value, const format_specs& spec) {
    using uint_type = uint32_or_64_or_128_t<T>;
    int_writer<iterator, Char, uint_type> w(out_, locale_, value, spec);
    handle_int_type_spec(spec.type, w);
    out_ = w.out;
  }